

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testHasVolume<Imath_2_5::Vec2<int>>(char *type)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int *piVar6;
  char *in_RDI;
  Box<Imath_2_5::Vec2<int>_> b_2;
  Vec2<int> max;
  Vec2<int> min;
  Box<Imath_2_5::Vec2<int>_> b1;
  uint i;
  Vec2<int> p1;
  Vec2<int> p0;
  Box<Imath_2_5::Vec2<int>_> b0;
  Box<Imath_2_5::Vec2<int>_> b_1;
  Box<Imath_2_5::Vec2<int>_> b;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff78;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff80;
  Vec2<int> local_74 [3];
  uint local_5c;
  Vec2<int> local_58;
  Vec2<int> local_50;
  Vec2<int> local_48;
  Vec2<int> local_40 [7];
  char *local_8;
  
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    hasVolume() for type ");
  poVar5 = std::operator<<(poVar5,local_8);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::hasVolume(in_stack_ffffffffffffff78);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x355,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::makeInfinite(in_stack_ffffffffffffff80);
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::hasVolume(in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x35e,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(local_40,-1);
  Imath_2_5::Vec2<int>::Vec2(&local_48,1);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::hasVolume(in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("b0.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x369,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(&local_50);
  Imath_2_5::Vec2<int>::Vec2(&local_58);
  local_5c = 0;
  while( true ) {
    uVar4 = local_5c;
    uVar3 = Imath_2_5::Vec2<int>::dimensions();
    if (uVar3 <= uVar4) break;
    cVar1 = (char)local_5c;
    piVar6 = Imath_2_5::Vec2<int>::operator[](&local_50,local_5c);
    *piVar6 = -(1 << (cVar1 + 1U & 0x1f));
    uVar4 = Imath_2_5::Vec2<int>::dimensions();
    cVar1 = (char)local_5c;
    piVar6 = Imath_2_5::Vec2<int>::operator[](&local_58,local_5c);
    *piVar6 = 1 << ((char)uVar4 - cVar1 & 0x1fU);
    local_5c = local_5c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::hasVolume(in_stack_ffffffffffffff78);
  if (!bVar2) {
    __assert_fail("b1.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x373,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  Imath_2_5::Vec2<int>::Vec2(local_74,0);
  Imath_2_5::Vec2<int>::Vec2((Vec2<int> *)&stack0xffffffffffffff84,local_74);
  uVar3 = Imath_2_5::Vec2<int>::dimensions();
  piVar6 = Imath_2_5::Vec2<int>::operator[]((Vec2<int> *)&stack0xffffffffffffff84,uVar3 - 1);
  *piVar6 = 2;
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            (in_stack_ffffffffffffff80,&in_stack_ffffffffffffff78->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff74,uVar4));
  bVar2 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::hasVolume(in_stack_ffffffffffffff78);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.hasVolume()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,900,
                  "void (anonymous namespace)::testHasVolume(const char *) [T = Imath_2_5::Vec2<int>]"
                 );
  }
  return;
}

Assistant:

void
testHasVolume(const char *type)
{
    cout << "    hasVolume() for type " << type << endl;

    //
    // Empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert(!b.hasVolume());
    }

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.hasVolume());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(b0.hasVolume());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(b1.hasVolume());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.hasVolume());
    }
}